

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall SQFuncState::AddInstruction(SQFuncState *this,SQInstruction *i)

{
  SQUnsignedInteger *pSVar1;
  byte bVar2;
  int iVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  SQInstruction *pSVar8;
  byte bVar9;
  uchar uVar10;
  SQUnsignedInteger SVar11;
  
  SVar4 = (this->_instructions)._size;
  if ((((long)SVar4 < 1) || (this->_optimization != true)) || (bVar9 = i->op, 0x22 < bVar9))
  goto switchD_001154c6_caseD_2;
  pSVar8 = (this->_instructions)._vals;
  switch(bVar9) {
  case 0:
    if (pSVar8[SVar4 - 1].op == '\0') {
      (this->_instructions)._size = SVar4 - 1;
      pSVar1 = &(this->_lineinfos)._size;
      *pSVar1 = *pSVar1 - 1;
    }
    break;
  case 1:
    iVar3 = i->_arg1;
    if (iVar3 < 0x100 && pSVar8[SVar4 - 1].op == '\x01') {
      pSVar8[SVar4 - 1].op = '\x04';
      pSVar8[SVar4 - 1]._arg2 = i->_arg0;
      pSVar8[SVar4 - 1]._arg3 = (uchar)iVar3;
      return;
    }
    break;
  case 7:
    if (((pSVar8[SVar4 - 1].op == '\x01') &&
        (bVar9 = pSVar8[SVar4 - 1]._arg0, i->_arg1 == (uint)bVar9)) &&
       (((this->_vlocals)._size <= (ulong)bVar9 ||
        ((this->_vlocals)._vals[bVar9]._name.super_SQObject._type == OT_NULL)))) {
      pSVar8[SVar4 - 1].op = '\b';
      pSVar8[SVar4 - 1]._arg0 = i->_arg0;
      pSVar8[SVar4 - 1]._arg2 = i->_arg2;
      uVar10 = i->_arg3;
LAB_0011581e:
      pSVar8[SVar4 - 1]._arg3 = uVar10;
      return;
    }
    break;
  case 10:
    bVar9 = pSVar8[SVar4 - 1].op;
    if (bVar9 < 0x1b) {
      if (((0x47e400eU >> (bVar9 & 0x1f) & 1) != 0) && (i->_arg1 == (uint)pSVar8[SVar4 - 1]._arg0))
      {
        pSVar8[SVar4 - 1]._arg0 = i->_arg0;
        this->_optimization = false;
        return;
      }
      if (bVar9 == 10) {
        pSVar8[SVar4 - 1].op = '\x1b';
        pSVar8[SVar4 - 1]._arg2 = i->_arg0;
        uVar10 = (uchar)i->_arg1;
        goto LAB_0011581e;
      }
    }
    break;
  case 0xb:
  case 0xd:
    if (i->_arg0 != i->_arg3) break;
    goto LAB_001156f2;
  case 0xe:
    if (((pSVar8[SVar4 - 1].op == '\x01') && (bVar9 = pSVar8[SVar4 - 1]._arg0, bVar9 == i->_arg2))
       && (((this->_vlocals)._size <= (ulong)bVar9 ||
           ((this->_vlocals)._vals[bVar9]._name.super_SQObject._type == OT_NULL)))) {
      pSVar8[SVar4 - 1]._arg2 = (uchar)i->_arg1;
      pSVar8[SVar4 - 1].op = '\t';
      pSVar8[SVar4 - 1]._arg0 = i->_arg0;
      return;
    }
    break;
  case 0xf:
  case 0x10:
    if (((pSVar8[SVar4 - 1].op != '\x01') ||
        (bVar2 = pSVar8[SVar4 - 1]._arg0, i->_arg1 != (uint)bVar2)) ||
       (((ulong)bVar2 < (this->_vlocals)._size &&
        ((this->_vlocals)._vals[bVar2]._name.super_SQObject._type != OT_NULL)))) break;
    pSVar8[SVar4 - 1].op = bVar9;
    pSVar8[SVar4 - 1]._arg0 = i->_arg0;
    bVar9 = i->_arg2;
    goto LAB_00115787;
  case 0x17:
    if ((((this->_parent == (SQFuncState *)0x0) || (i->_arg0 == 0xff)) ||
        (pSVar8[SVar4 - 1].op != '\x06')) || ((long)(SVar4 - 1) <= this->_returnexp)) {
      if (pSVar8[SVar4 - 1].op == '<') {
        pSVar8[SVar4 - 1] = *i;
        return;
      }
    }
    else {
      pSVar8[SVar4 - 1].op = '\x05';
    }
    break;
  case 0x18:
    if ((pSVar8[SVar4 - 1].op == '\x18') &&
       ((uint)pSVar8[SVar4 - 1]._arg0 + pSVar8[SVar4 - 1]._arg1 == (uint)i->_arg0)) {
      pSVar8[SVar4 - 1]._arg1 = pSVar8[SVar4 - 1]._arg1 + 1;
      pSVar8[SVar4 - 1].op = '\x18';
      return;
    }
    break;
  case 0x1e:
    if ((pSVar8[SVar4 - 1].op == '(') && (iVar3 = pSVar8[SVar4 - 1]._arg1, iVar3 < 0xff)) {
      pSVar8[SVar4 - 1].op = '\x1d';
      pSVar8[SVar4 - 1]._arg0 = (uchar)iVar3;
      pSVar8[SVar4 - 1]._arg1 = i->_arg1;
      return;
    }
    break;
  case 0x1f:
    if (i->_arg0 != i->_arg2) break;
LAB_001156f2:
    i->_arg0 = 0xff;
    break;
  case 0x22:
    bVar2 = pSVar8[SVar4 - 1].op;
    bVar9 = 0xff;
    bVar7 = true;
    if (bVar2 < 3) {
      if ((bVar2 == 1) || (bVar2 == 2)) {
LAB_00115750:
        bVar7 = false;
        bVar9 = bVar2;
      }
    }
    else {
      if (bVar2 == 3) goto LAB_00115750;
      if (bVar2 == 0x1a) {
        bVar9 = 4;
        bVar7 = false;
      }
    }
    if (((!bVar7) && (bVar2 = pSVar8[SVar4 - 1]._arg0, i->_arg1 == (uint)bVar2)) &&
       (((this->_vlocals)._size <= (ulong)bVar2 ||
        ((this->_vlocals)._vals[bVar2]._name.super_SQObject._type == OT_NULL)))) {
      pSVar8[SVar4 - 1].op = '\"';
      pSVar8[SVar4 - 1]._arg0 = i->_arg0;
LAB_00115787:
      pSVar8[SVar4 - 1]._arg2 = bVar9;
      pSVar8[SVar4 - 1]._arg3 = 0xff;
      return;
    }
  }
switchD_001154c6_caseD_2:
  this->_optimization = true;
  uVar5 = (this->_instructions)._size;
  uVar6 = (this->_instructions)._allocated;
  if (uVar6 <= uVar5) {
    SVar4 = uVar5 * 2;
    SVar11 = 4;
    if (SVar4 != 0) {
      SVar11 = SVar4;
    }
    pSVar8 = (SQInstruction *)sq_vm_realloc((this->_instructions)._vals,uVar6 << 3,SVar11 * 8);
    (this->_instructions)._vals = pSVar8;
    (this->_instructions)._allocated = SVar11;
  }
  SVar4 = (this->_instructions)._size;
  (this->_instructions)._size = SVar4 + 1;
  (this->_instructions)._vals[SVar4] = *i;
  return;
}

Assistant:

void SQFuncState::AddInstruction(SQInstruction &i)
{
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){ //simple optimizer
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(i.op) {
        case _OP_JZ:
            if( pi.op == _OP_CMP && pi._arg1 < 0xFF) {
                pi.op = _OP_JCMP;
                pi._arg0 = (unsigned char)pi._arg1;
                pi._arg1 = i._arg1;
                return;
            }
            break;
        case _OP_SET:
        case _OP_NEWSLOT:
            if(i._arg0 == i._arg3) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_SETOUTER:
            if(i._arg0 == i._arg2) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_RETURN:
            if( _parent && i._arg0 != MAX_FUNC_STACKSIZE && pi.op == _OP_CALL && _returnexp < size-1) {
                pi.op = _OP_TAILCALL;
            } else if(pi.op == _OP_CLOSE){
                pi = i;
                return;
            }
        break;
        case _OP_GET:
            if( pi.op == _OP_LOAD && pi._arg0 == i._arg2 && (!IsLocal(pi._arg0))){
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)i._arg1;
                pi.op = _OP_GETK;
                pi._arg0 = i._arg0;

                return;
            }
        break;
        case _OP_PREPCALL:
            if( pi.op == _OP_LOAD  && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_PREPCALLK;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = i._arg3;
                return;
            }
            break;
        case _OP_APPENDARRAY: {
            SQInteger aat = -1;
            switch(pi.op) {
            case _OP_LOAD: aat = AAT_LITERAL; break;
            case _OP_LOADINT: aat = AAT_INT; break;
            case _OP_LOADBOOL: aat = AAT_BOOL; break;
            case _OP_LOADFLOAT: aat = AAT_FLOAT; break;
            default: break;
            }
            if(aat != -1 && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_APPENDARRAY;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)aat;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
                              }
            break;
        case _OP_MOVE:
            switch(pi.op) {
            case _OP_GET: case _OP_ADD: case _OP_SUB: case _OP_MUL: case _OP_DIV: case _OP_MOD: case _OP_BITW:
            case _OP_LOADINT: case _OP_LOADFLOAT: case _OP_LOADBOOL: case _OP_LOAD:

                if(pi._arg0 == i._arg1)
                {
                    pi._arg0 = i._arg0;
                    _optimization = false;
                    //_result_elimination = false;
                    return;
                }
            }

            if(pi.op == _OP_MOVE)
            {
                pi.op = _OP_DMOVE;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_LOAD:
            if(pi.op == _OP_LOAD && i._arg1 < 256) {
                pi.op = _OP_DLOAD;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_EQ:case _OP_NE:
            if(pi.op == _OP_LOAD && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0) ))
            {
                pi.op = i.op;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
            break;
        case _OP_LOADNULLS:
            if((pi.op == _OP_LOADNULLS && pi._arg0+pi._arg1 == i._arg0)) {

                pi._arg1 = pi._arg1 + 1;
                pi.op = _OP_LOADNULLS;
                return;
            }
            break;
        case _OP_LINE:
            if(pi.op == _OP_LINE) {
                _instructions.pop_back();
                _lineinfos.pop_back();
            }
            break;
        }
    }
    _optimization = true;
    _instructions.push_back(i);
}